

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

void NULLCVector::ConstructVector(vector *vec,uint type,int reserved)

{
  uint uVar1;
  NULLCArray NVar2;
  char *local_38;
  uint local_30;
  NULLCArray data;
  int reserved_local;
  uint type_local;
  vector *vec_local;
  
  vec->elemType = type;
  uVar1 = nullcIsPointer(type);
  vec->flags = uVar1;
  vec->size = 0;
  uVar1 = nullcGetTypeSize(type);
  vec->elemSize = uVar1;
  (vec->data).typeID = type;
  if (reserved == 0) {
    (vec->data).ptr = (char *)0x0;
    (vec->data).len = 0;
  }
  else {
    NVar2 = nullcAllocateArrayTyped(type,reserved);
    local_38 = NVar2.ptr;
    local_30 = NVar2.len;
    (vec->data).ptr = local_38;
    (vec->data).len = local_30;
  }
  return;
}

Assistant:

void ConstructVector(vector* vec, unsigned int type, int reserved)
	{
		vec->elemType = type;
		vec->flags = nullcIsPointer(type);
		vec->size = 0;
		vec->elemSize = nullcGetTypeSize(type);
		vec->data.typeID = type;
		if(reserved)
		{
			NULLCArray data = nullcAllocateArrayTyped(type, reserved);

			vec->data.ptr = data.ptr;
			vec->data.len = data.len;
		}else{
			vec->data.ptr = 0;
			vec->data.len = 0;
		}
	}